

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor_broker.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  __sighandler_t __handler;
  int __sig;
  Creature *cr;
  Creature goblin;
  Game g;
  DoubleAttackModifier dam;
  undefined1 local_a0 [16];
  _Alloc_hider local_90;
  size_type local_88;
  char local_80 [16];
  signal<void_(Query_&),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(Query_&)>,_boost::function<void_(const_boost::signals2::connection_&,_Query_&)>,_boost::signals2::mutex>
  local_70;
  DoubleAttackModifier local_58;
  char *local_30;
  size_type local_28;
  char local_20 [8];
  undefined8 uStack_18;
  
  boost::signals2::
  signal<void_(Query_&),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(Query_&)>,_boost::function<void_(const_boost::signals2::connection_&,_Query_&)>,_boost::signals2::mutex>
  ::signal(&local_70,(int)local_a0,(__sighandler_t)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Goblin",(allocator<char> *)&local_58);
  local_90._M_p = local_80;
  local_a0._8_4_ = 2;
  local_a0._12_4_ = 2;
  if (local_30 == local_20) {
    local_80[8] = (undefined1)uStack_18;
    local_80[9] = uStack_18._1_1_;
    local_80[10] = uStack_18._2_1_;
    local_80[0xb] = uStack_18._3_1_;
    local_80[0xc] = uStack_18._4_1_;
    local_80[0xd] = uStack_18._5_1_;
    local_80[0xe] = uStack_18._6_1_;
    local_80[0xf] = uStack_18._7_1_;
  }
  else {
    local_90._M_p = local_30;
  }
  local_88 = local_28;
  local_28 = 0;
  local_20[0] = '\0';
  local_a0._0_8_ = &local_70;
  local_30 = local_20;
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = operator<<((ostream *)&std::cout,(Creature *)local_a0);
  std::endl<char,std::char_traits<char>>(poVar1);
  DoubleAttackModifier::DoubleAttackModifier(&local_58,(Game *)&local_70,(Creature *)local_a0);
  poVar1 = operator<<((ostream *)&std::cout,(Creature *)local_a0);
  std::endl<char,std::char_traits<char>>(poVar1);
  DoubleAttackModifier::~DoubleAttackModifier(&local_58);
  cr = (Creature *)local_a0;
  poVar1 = operator<<((ostream *)&std::cout,cr);
  __sig = (int)cr;
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_90);
  boost::signals2::
  signal<void_(Query_&),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(Query_&)>,_boost::function<void_(const_boost::signals2::connection_&,_Query_&)>,_boost::signals2::mutex>
  ::~signal(&local_70,__sig,__handler);
  return 0;
}

Assistant:

int main()
{
	Game g{};
	Creature goblin{g, "Goblin", 2, 2};
	std::cout << goblin << std::endl;

	{
		DoubleAttackModifier dam{g, goblin};
		std::cout << goblin << std::endl;
	}

	std::cout << goblin << std::endl;
	return 0;
}